

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O2

Amap_Item_t * Amap_LibertyCellOutput(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  int iVar1;
  Amap_Item_t *pPin;
  Amap_Item_t *pAVar2;
  int *piVar3;
  
  piVar3 = &pCell->Child;
  while( true ) {
    pPin = Amap_LibertyItem(p,*piVar3);
    if (pPin == (Amap_Item_t *)0x0) {
      return (Amap_Item_t *)0x0;
    }
    iVar1 = Amap_LibertyCompare(p,pPin->Key,"pin");
    if ((iVar1 == 0) && (pAVar2 = Amap_LibertyPinFunction(p,pPin), pAVar2 != (Amap_Item_t *)0x0))
    break;
    piVar3 = &pPin->Next;
  }
  return pPin;
}

Assistant:

Amap_Item_t * Amap_LibertyCellOutput( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pPin;
    Amap_ItemForEachChild( p, pCell, pPin )
    {
        if ( Amap_LibertyCompare(p, pPin->Key, "pin") )
            continue;
        if ( Amap_LibertyPinFunction(p, pPin) )
            return pPin;
    }
    return NULL;
}